

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DTDScanner::scanDefaultDecl(DTDScanner *this,DTDAttDef *toFill)

{
  XMLBufferMgr *this_00;
  bool bVar1;
  AttTypes type;
  XMLCh *pXVar2;
  XMLBuffer *toFill_00;
  undefined1 local_28 [8];
  XMLBufBid bbValue;
  DTDAttDef *toFill_local;
  DTDScanner *this_local;
  
  bbValue.fMgr = (XMLBufferMgr *)toFill;
  bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgRequiredString);
  if (bVar1) {
    XMLAttDef::setDefaultType((XMLAttDef *)bbValue.fMgr,Required);
  }
  else {
    bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgImpliedString);
    if (bVar1) {
      XMLAttDef::setDefaultType((XMLAttDef *)bbValue.fMgr,Implied);
    }
    else {
      bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgFixedString);
      if (bVar1) {
        bVar1 = ReaderMgr::skippedSpace(this->fReaderMgr);
        if (bVar1) {
          ReaderMgr::skipPastSpaces(this->fReaderMgr);
        }
        else {
          XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
        }
        XMLAttDef::setDefaultType((XMLAttDef *)bbValue.fMgr,Fixed);
      }
      else {
        XMLAttDef::setDefaultType((XMLAttDef *)bbValue.fMgr,DefAttTypes_Min);
      }
      checkForPERef(this,false,true);
      XMLBufBid::XMLBufBid((XMLBufBid *)local_28,this->fBufMgr);
      pXVar2 = (XMLCh *)(**(code **)((bbValue.fMgr)->fBufCount + 0x28))();
      toFill_00 = XMLBufBid::getBuffer((XMLBufBid *)local_28);
      type = XMLAttDef::getType((XMLAttDef *)bbValue.fMgr);
      bVar1 = scanAttValue(this,pXVar2,toFill_00,type);
      if (!bVar1) {
        XMLScanner::emitError(this->fScanner,ExpectedDefAttrDecl);
      }
      this_00 = bbValue.fMgr;
      pXVar2 = XMLBufBid::getRawBuffer((XMLBufBid *)local_28);
      XMLAttDef::setValue((XMLAttDef *)this_00,pXVar2);
      XMLBufBid::~XMLBufBid((XMLBufBid *)local_28);
    }
  }
  return;
}

Assistant:

void DTDScanner::scanDefaultDecl(DTDAttDef& toFill)
{
    if (fReaderMgr->skippedString(XMLUni::fgRequiredString))
    {
        toFill.setDefaultType(XMLAttDef::Required);
        return;
    }

    if (fReaderMgr->skippedString(XMLUni::fgImpliedString))
    {
        toFill.setDefaultType(XMLAttDef::Implied);
        return;
    }

    if (fReaderMgr->skippedString(XMLUni::fgFixedString))
    {
        //
        //  There must be space before the fixed value. If there is not, then
        //  emit an error but keep going.
        //
        if (!fReaderMgr->skippedSpace())
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
        else
            fReaderMgr->skipPastSpaces();
        toFill.setDefaultType(XMLAttDef::Fixed);
    }
     else
    {
        toFill.setDefaultType(XMLAttDef::Default);
    }

    //
    //  If we got here, its fixed or default, so we need to get a value.
    //  If we don't, then emit an error but just set the default value to
    //  an empty string and try to keep going.
    //
    // Check for PE ref or optional whitespace
    checkForPERef(false, true);

    XMLBufBid bbValue(fBufMgr);
    if (!scanAttValue(toFill.getFullName(), bbValue.getBuffer(), toFill.getType()))
        fScanner->emitError(XMLErrs::ExpectedDefAttrDecl);

    toFill.setValue(bbValue.getRawBuffer());
}